

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

char * to_pls_layout(PlsFormat format)

{
  char *pcStack_10;
  PlsFormat format_local;
  
  switch(format) {
  case PlsR11FG11FB10F:
    pcStack_10 = "layout(r11f_g11f_b10f) ";
    break;
  case PlsR32F:
    pcStack_10 = "layout(r32f) ";
    break;
  case PlsRG16F:
    pcStack_10 = "layout(rg16f) ";
    break;
  case PlsRGB10A2:
    pcStack_10 = "layout(rgb10_a2) ";
    break;
  case PlsRGBA8:
    pcStack_10 = "layout(rgba8) ";
    break;
  case PlsRG16:
    pcStack_10 = "layout(rg16) ";
    break;
  case PlsRGBA8I:
    pcStack_10 = "layout(rgba8i)";
    break;
  case PlsRG16I:
    pcStack_10 = "layout(rg16i) ";
    break;
  case PlsRGB10A2UI:
    pcStack_10 = "layout(rgb10_a2ui) ";
    break;
  case PlsRGBA8UI:
    pcStack_10 = "layout(rgba8ui) ";
    break;
  case PlsRG16UI:
    pcStack_10 = "layout(rg16ui) ";
    break;
  case PlsR32UI:
    pcStack_10 = "layout(r32ui) ";
    break;
  default:
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

static const char *to_pls_layout(PlsFormat format)
{
	switch (format)
	{
	case PlsR11FG11FB10F:
		return "layout(r11f_g11f_b10f) ";
	case PlsR32F:
		return "layout(r32f) ";
	case PlsRG16F:
		return "layout(rg16f) ";
	case PlsRGB10A2:
		return "layout(rgb10_a2) ";
	case PlsRGBA8:
		return "layout(rgba8) ";
	case PlsRG16:
		return "layout(rg16) ";
	case PlsRGBA8I:
		return "layout(rgba8i)";
	case PlsRG16I:
		return "layout(rg16i) ";
	case PlsRGB10A2UI:
		return "layout(rgb10_a2ui) ";
	case PlsRGBA8UI:
		return "layout(rgba8ui) ";
	case PlsRG16UI:
		return "layout(rg16ui) ";
	case PlsR32UI:
		return "layout(r32ui) ";
	default:
		return "";
	}
}